

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

void __thiscall jbcoin::ValidatorKeys::writeToFile(ValidatorKeys *this,path *keyFile)

{
  undefined4 uVar1;
  char *value;
  Value *pVVar2;
  runtime_error *prVar3;
  size_t in_R8;
  bool bVar4;
  Value jv;
  error_code ec;
  ofstream o;
  Value VStack_288;
  string local_278;
  ValueHolder local_258 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  error_code local_238;
  ValueHolder local_228;
  long local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  Json::Value::Value(&VStack_288,nullValue);
  value = to_string(this->keyType_);
  Json::Value::Value((Value *)&local_228,value);
  pVVar2 = Json::Value::operator[](&VStack_288,"key_type");
  Json::Value::operator=(pVVar2,(Value *)&local_228);
  Json::Value::~Value((Value *)&local_228);
  base58EncodeToken_abi_cxx11_
            ((string *)&local_228,(jbcoin *)0x1c,(char)this + '\x10',
             (void *)(this->publicKey_).size_,in_R8);
  Json::Value::Value((Value *)local_258,(string *)&local_228);
  pVVar2 = Json::Value::operator[](&VStack_288,"public_key");
  Json::Value::operator=(pVVar2,(Value *)local_258);
  Json::Value::~Value((Value *)local_258);
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  base58EncodeToken_abi_cxx11_
            ((string *)&local_228,(jbcoin *)&DAT_00000020,(char)this + '8',&DAT_00000020,in_R8);
  Json::Value::Value((Value *)local_258,(string *)&local_228);
  pVVar2 = Json::Value::operator[](&VStack_288,"secret_key");
  Json::Value::operator=(pVVar2,(Value *)local_258);
  Json::Value::~Value((Value *)local_258);
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  Json::Value::Value((Value *)&local_228,this->tokenSequence_);
  pVVar2 = Json::Value::operator[](&VStack_288,"token_sequence");
  Json::Value::operator=(pVVar2,(Value *)&local_228);
  Json::Value::~Value((Value *)&local_228);
  Json::Value::Value((Value *)&local_228,this->revoked_);
  pVVar2 = Json::Value::operator[](&VStack_288,"revoked");
  Json::Value::operator=(pVVar2,(Value *)&local_228);
  Json::Value::~Value((Value *)&local_228);
  boost::filesystem::path::parent_path();
  if (local_228 != &local_218) {
    operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
  }
  if (local_220 != 0) {
    local_238.val_ = 0;
    local_238.failed_ = false;
    local_238.cat_ =
         (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
    boost::filesystem::path::parent_path();
    boost::filesystem::detail::status
              ((detail *)&local_258[0].bool_,(path *)&local_228,(error_code *)0x0);
    uVar1 = local_258[0].int_;
    if (local_228 != &local_218) {
      operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
    }
    if ((uint)uVar1 < 2) {
      boost::filesystem::path::parent_path();
      boost::filesystem::detail::create_directories((path *)&local_228,&local_238);
      if (local_228 != &local_218) {
        operator_delete(local_228.string_,local_218._M_allocated_capacity + 1);
      }
    }
    bVar4 = true;
    if (local_238.failed_ == false) {
      boost::filesystem::path::parent_path();
      boost::filesystem::detail::status
                ((detail *)&local_228.bool_,(path *)local_258,(error_code *)0x0);
      bVar4 = local_228.int_ != 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_258[0]._4_4_,local_258[0].int_) != &local_248) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_258[0]._4_4_,local_258[0].int_),
                        local_248._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      boost::filesystem::path::parent_path();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                     ,"Cannot create directory: ",&local_278);
      std::runtime_error::runtime_error(prVar3,(string *)&local_228.bool_);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::ofstream::ofstream(&local_228,(string *)keyFile,_S_trunc);
  if ((abStack_208[*(long *)(local_228.string_ + -0x18)] & 5) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_278,"Cannot open key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::runtime_error::runtime_error(prVar3,(string *)&local_278);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Value::toStyledString_abi_cxx11_(&local_278,&VStack_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,local_278._M_dataplus._M_p,local_278._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_228.string_ = _VTT;
  *(undefined8 *)((long)&local_228 + *(long *)(_VTT + -0x18)) = _pthread_attr_getdetachstate;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  Json::Value::~Value(&VStack_288);
  return;
}

Assistant:

void
ValidatorKeys::writeToFile (
    boost::filesystem::path const& keyFile) const
{
    using namespace boost::filesystem;

    Json::Value jv;
    jv["key_type"] = to_string(keyType_);
    jv["public_key"] = toBase58(TOKEN_NODE_PUBLIC, publicKey_);
    jv["secret_key"] = toBase58(TOKEN_NODE_PRIVATE, secretKey_);
    jv["token_sequence"] = Json::UInt (tokenSequence_);
    jv["revoked"] = revoked_;

    if (! keyFile.parent_path().empty())
    {
        boost::system::error_code ec;
        if (! exists (keyFile.parent_path()))
            boost::filesystem::create_directories(keyFile.parent_path(), ec);

        if (ec || ! is_directory (keyFile.parent_path()))
            throw std::runtime_error ("Cannot create directory: " +
                    keyFile.parent_path().string());
    }

    std::ofstream o (keyFile.string (), std::ios_base::trunc);
    if (o.fail())
        throw std::runtime_error ("Cannot open key file: " +
            keyFile.string());

    o << jv.toStyledString();
}